

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

bool __thiscall
PruneReplayer::enqueue_create_graphics_pipeline
          (PruneReplayer *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  int *piVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  mapped_type *ppVVar10;
  ulong uVar11;
  __node_base_ptr p_Var12;
  bool bVar13;
  ulong uVar14;
  long lVar15;
  key_type local_40;
  Hash local_38;
  
  *pipeline = (VkPipeline)hash;
  local_38 = hash;
  bVar5 = filter_object(this,RESOURCE_GRAPHICS_PIPELINE,hash);
  if (bVar5) {
    if (create_info->stageCount != 0) {
      lVar15 = 0x18;
      uVar14 = 0;
      do {
        bVar5 = filter_shader_module(this,*(Hash *)((long)&create_info->pStages->sType + lVar15));
        if (bVar5) {
          bVar5 = true;
          goto LAB_00111e0d;
        }
        uVar14 = uVar14 + 1;
        lVar15 = lVar15 + 0x30;
      } while (uVar14 < create_info->stageCount);
    }
    bVar5 = false;
LAB_00111e0d:
    bVar4 = true;
    if (create_info->stageCount != 0) {
      lVar15 = 0x18;
      uVar14 = 0;
      do {
        local_40 = *(key_type *)((long)&create_info->pStages->sType + lVar15);
        sVar6 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->banned_modules)._M_h,&local_40);
        if (sVar6 != 0) {
          bVar4 = false;
          break;
        }
        uVar14 = uVar14 + 1;
        lVar15 = lVar15 + 0x30;
        bVar4 = bVar5;
      } while (uVar14 < create_info->stageCount);
    }
    for (piVar7 = (int *)create_info->pNext; piVar7 != (int *)0x0; piVar7 = *(int **)(piVar7 + 2)) {
      if (*piVar7 == 0x3b9f36d0) goto LAB_00111e93;
    }
    piVar7 = (int *)0x0;
LAB_00111e93:
    bVar5 = bVar4;
    if (piVar7 != (int *)0x0) {
      if (piVar7[4] == 0) {
        bVar13 = false;
      }
      else {
        uVar14 = 0;
        bVar13 = false;
        do {
          local_40 = *(key_type *)(*(long *)(piVar7 + 6) + uVar14 * 8);
          sVar6 = std::
                  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&(this->banned_graphics)._M_h,&local_40);
          if (sVar6 != 0) {
            bVar4 = false;
            break;
          }
          if (!bVar13) {
            p_Var9 = *(_Hash_node_base **)(*(long *)(piVar7 + 6) + uVar14 * 8);
            uVar1 = (this->graphics_pipelines)._M_h._M_bucket_count;
            uVar11 = (ulong)p_Var9 % uVar1;
            p_Var2 = (this->graphics_pipelines)._M_h._M_buckets[uVar11];
            p_Var8 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var8 = p_Var2, p_Var12 = p_Var2->_M_nxt, p_Var2->_M_nxt[1]._M_nxt != p_Var9)) {
              while (p_Var3 = p_Var12->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
                p_Var8 = (__node_base_ptr)0x0;
                if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar11) ||
                   (p_Var8 = p_Var12, p_Var12 = p_Var3, p_Var3[1]._M_nxt == p_Var9))
                goto LAB_00111f4c;
              }
              p_Var8 = (__node_base_ptr)0x0;
            }
LAB_00111f4c:
            if (p_Var8 == (__node_base_ptr)0x0) {
              p_Var9 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var9 = p_Var8->_M_nxt;
            }
            if ((p_Var9 != (_Hash_node_base *)0x0) &&
               (*(int *)((long)&p_Var9[2]._M_nxt[2]._M_nxt + 4) != 0)) {
              bVar13 = true;
            }
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (uint)piVar7[4]);
      }
      bVar5 = bVar4;
      if ((create_info->stageCount == 0) && (bVar5 = bVar13, !bVar4)) {
        bVar5 = false;
      }
    }
    if (((create_info->flags & 0x800) != 0) && (create_info->stageCount == 0)) {
      bVar5 = false;
    }
    lVar15 = 0x430;
    if (bVar5) goto LAB_00111fc9;
  }
  lVar15 = 0x4a0;
  if ((create_info->flags & 0x800) == 0) {
    return true;
  }
LAB_00111fc9:
  ppVVar10 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkGraphicsPipelineCreateInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)((long)&(this->super_StateCreatorInterface)._vptr_StateCreatorInterface
                             + lVar15),&local_38);
  *ppVVar10 = create_info;
  return true;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);
		bool allow_pipeline = false;

		if (filter_object(RESOURCE_GRAPHICS_PIPELINE, hash))
		{
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (filter_shader_module((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = true;
					break;
				}
			}

			if (create_info->stageCount == 0)
				allow_pipeline = true;

			// Need to test this as well, if there is at least one banned module used, we don't allow the pipeline.
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (banned_modules.count((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = false;
					break;
				}
			}

			auto *library_info =
					find_pnext<VkPipelineLibraryCreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR,
					                                           create_info->pNext);

			if (library_info)
			{
				bool has_default_allowed_library = false;
				for (uint32_t i = 0; i < library_info->libraryCount; i++)
				{
					if (banned_graphics.count((Hash) library_info->pLibraries[i]))
					{
						allow_pipeline = false;
						break;
					}

					if (!has_default_allowed_library)
					{
						// Only consider libraries which contain modules.
						auto itr = graphics_pipelines.find((Hash) library_info->pLibraries[i]);
						if (itr != graphics_pipelines.end() && itr->second->stageCount != 0)
							has_default_allowed_library = true;
					}
				}

				// At least one of the dependent libraries must be considered allowed to pass.
				if (create_info->stageCount == 0 && allow_pipeline)
					allow_pipeline = has_default_allowed_library;
			}

			// Never include libraries by default unless they contain real code.
			if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && create_info->stageCount == 0)
				allow_pipeline = false;
		}

		// Need to defer this since we need to access pipeline libraries.
		if (allow_pipeline)
			graphics_pipelines[hash] = create_info;
		else if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0)
			library_graphics_pipelines[hash] = create_info;

		return true;
	}